

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::ClassNameWorker_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumDescriptor *descriptor)

{
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  if (*(objectivec **)(this + 0x18) != (objectivec *)0x0) {
    ClassNameWorker_abi_cxx11_(&local_40,*(objectivec **)(this + 0x18),(Descriptor *)descriptor);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::append((char *)&local_60);
  }
  std::operator+(__return_storage_ptr__,&local_60,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameWorker(const EnumDescriptor* descriptor) {
  string name;
  if (descriptor->containing_type() != NULL) {
    name = ClassNameWorker(descriptor->containing_type());
    name += "_";
  }
  return name + descriptor->name();
}